

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tvrq_api.c
# Opt level: O0

int RqInterInit(int nK,int nMaxExtra,RqInterWorkMem *pInterWorkMem,size_t nInterWorkMemSize)

{
  ulong in_RCX;
  int *in_RDX;
  int in_ESI;
  int in_EDI;
  undefined1 local_4c [44];
  ulong local_20;
  int *local_18;
  int local_4;
  
  if (in_RCX < 0x34) {
    fprintf(_stderr,"Error:%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/lorinder[P]TvRQ/api/tvrq_api.c",
            0x55,"Insufficient inter work memory size.");
    local_4 = -1;
  }
  else {
    local_20 = in_RCX;
    local_18 = in_RDX;
    parameters_get(in_ESI);
    memcpy(in_RDX,local_4c,0x2c);
    if (*local_18 == -1) {
      fprintf(_stderr,"Error:%s:%d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/lorinder[P]TvRQ/api/tvrq_api.c"
              ,0x5a,"Unsupported K value.");
      local_4 = -2;
    }
    else {
      local_18[0xb] = (int)(local_20 - 0x34 >> 2);
      if (local_18[0xb] < in_EDI + in_ESI) {
        fprintf(_stderr,"Error:%s:%d: %s\n",
                "/workspace/llm4binary/github/license_all_cmakelists_25/lorinder[P]TvRQ/api/tvrq_api.c"
                ,0x61,"Insufficient inter work memory size.");
        local_4 = -1;
      }
      else {
        local_18[0xc] = 0;
        local_4 = 0;
      }
    }
  }
  return local_4;
}

Assistant:

int RqInterInit(int nK,
		   int nMaxExtra,
		   RqInterWorkMem* pInterWorkMem,
		   size_t nInterWorkMemSize)
{
	if (nInterWorkMemSize < sizeof(RqInterWorkMem)) {
		errmsg("Insufficient inter work memory size.");
		return RQ_ERR_ENOMEM;
	}
	pInterWorkMem->params = parameters_get(nK);
	if (pInterWorkMem->params.K == -1) {
		errmsg("Unsupported K value.");
		return RQ_ERR_EDOM;
	}
	assert(pInterWorkMem->params.K == nK);
	pInterWorkMem->nESI_max
	  = (nInterWorkMemSize - sizeof(RqInterWorkMem)) / sizeof(uint32_t);
	if (pInterWorkMem->nESI_max < nK + nMaxExtra) {
		errmsg("Insufficient inter work memory size.");
		return RQ_ERR_ENOMEM;
	}

	pInterWorkMem->nESI = 0;
	return 0;
}